

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcaf_grammar_repeat(int n,mpc_val_t **xs)

{
  char cVar1;
  int n_00;
  int *__ptr;
  mpc_parser_t *pmVar2;
  
  __ptr = (int *)xs[1];
  if (__ptr == (int *)0x0) {
    return *xs;
  }
  cVar1 = (char)*__ptr;
  if (cVar1 == '!') {
    free(__ptr);
    pmVar2 = mpca_not((mpc_parser_t *)*xs);
    return pmVar2;
  }
  if (cVar1 == '?') {
    free(__ptr);
    pmVar2 = mpc_maybe((mpc_parser_t *)*xs);
    return pmVar2;
  }
  if (cVar1 != '+') {
    if (cVar1 == '*') {
      free(__ptr);
      pmVar2 = mpca_many((mpc_parser_t *)*xs);
      return pmVar2;
    }
    n_00 = *__ptr;
    free(__ptr);
    pmVar2 = mpca_count(n_00,(mpc_parser_t *)*xs);
    return pmVar2;
  }
  free(__ptr);
  pmVar2 = mpca_many1((mpc_parser_t *)*xs);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcaf_grammar_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpca_many(xs[0]); }; break;
    case '+': { free(xs[1]); return mpca_many1(xs[0]); }; break;
    case '?': { free(xs[1]); return mpca_maybe(xs[0]); }; break;
    case '!': { free(xs[1]); return mpca_not(xs[0]); }; break;
    default:
      num = *((int*)xs[1]);
      free(xs[1]);
  }
  return mpca_count(num, xs[0]);
}